

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  undefined1 *puVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmGlobalGenerator *pcVar4;
  pointer puVar5;
  cmLocalGenerator *pcVar6;
  pointer pbVar7;
  cmValue cVar8;
  string *psVar9;
  ostream *poVar10;
  uint uVar11;
  undefined8 in_R8;
  pointer in_path;
  string_view str;
  string_view source;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view arg;
  string fc;
  string local_2f0;
  uint local_2cc;
  string cleanfile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string local_270;
  string local_250;
  ofstream fout;
  
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  puVar1 = &fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)puVar1
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fout,"ADDITIONAL_CLEAN_FILES","");
  cVar8 = cmMakefile::GetProperty(pcVar2,(string *)&fout);
  if (fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar1) {
    operator_delete(fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    pcVar3 = ((cVar8.Value)->_M_dataplus)._M_p;
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,pcVar3,pcVar3 + (cVar8.Value)->_M_string_length);
    pcVar2 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    cleanfile._M_dataplus._M_p = (pointer)&cleanfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cleanfile,"CMAKE_BUILD_TYPE","");
    psVar9 = cmMakefile::GetSafeDefinition(pcVar2,&cleanfile);
    fc._M_string_length = 0;
    fc.field_2._M_local_buf[0] = '\0';
    in_R8 = 0;
    fc._M_dataplus._M_p = (pointer)&fc.field_2;
    cmGeneratorExpression::Evaluate
              ((string *)&fout,&local_250,(cmLocalGenerator *)this,psVar9,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&fc);
    arg._M_str = (char *)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
    ;
    arg._M_len = fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
    cmExpandList(arg,&cleanFiles,false);
    if (fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)puVar1) {
      operator_delete(fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                      fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fc._M_dataplus._M_p != &fc.field_2) {
      operator_delete(fc._M_dataplus._M_p,
                      CONCAT71(fc.field_2._M_allocated_capacity._1_7_,fc.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cleanfile._M_dataplus._M_p != &cleanfile.field_2) {
      operator_delete(cleanfile._M_dataplus._M_p,cleanfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
  }
  if (cleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      cleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar4 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    puVar5 = (pcVar4->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pcVar4->LocalGenerators).
        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar5) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = (psVar9->_M_dataplus)._M_p;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)psVar9->_M_string_length;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0x27;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = anon_var_dwarf_20dc134;
    views._M_len = 2;
    views._M_array = (iterator)&fout;
    cmCatViews_abi_cxx11_(&cleanfile,views);
    std::ofstream::ofstream(&fout,cleanfile._M_dataplus._M_p,_S_out);
    uVar11 = *(uint *)(&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20 +
                      (long)fout.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream[-3]);
    if ((uVar11 & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&fout.super_basic_ostream<char,_std::char_traits<char>_>,"file(REMOVE_RECURSE\n",
                 0x14);
      pbVar7 = cleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_2cc = uVar11;
      if (cleanFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          cleanFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        in_path = cleanFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar6 = (puVar5->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
          cmsys::SystemTools::CollapseFullPath(&local_2f0,in_path,psVar9);
          cmOutputConverter::MaybeRelativeToCurBinDir
                    (&fc,&pcVar6->super_cmOutputConverter,&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
          str._M_str = (char *)0x0;
          str._M_len = (size_t)fc._M_dataplus._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    (&local_2f0,(cmOutputConverter *)fc._M_string_length,str,(WrapQuotes)in_R8);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                               local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fc._M_dataplus._M_p != &fc.field_2) {
            operator_delete(fc._M_dataplus._M_p,
                            CONCAT71(fc.field_2._M_allocated_capacity._1_7_,
                                     fc.field_2._M_local_buf[0]) + 1);
          }
          in_path = in_path + 1;
        } while (in_path != pbVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n",2);
      uVar11 = local_2cc;
    }
    else {
      std::operator+(&fc,"Could not create ",&cleanfile);
      cmSystemTools::Error(&fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fc._M_dataplus._M_p != &fc.field_2) {
        operator_delete(fc._M_dataplus._M_p,
                        CONCAT71(fc.field_2._M_allocated_capacity._1_7_,fc.field_2._M_local_buf[0])
                        + 1);
      }
    }
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = _VTT;
    *(undefined8 *)(_VTT[-3] + (long)&fout.super_basic_ostream<char,_std::char_traits<char>_>) =
         _EVP_PKEY_get_bn_param;
    std::filebuf::~filebuf
              ((filebuf *)&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
    std::ios_base::~ios_base
              ((ios_base *)&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    if ((uVar11 & 5) == 0) {
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_270,
                 &((puVar5->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                  super_cmOutputConverter,&cleanfile);
      source._M_str = local_270._M_dataplus._M_p;
      source._M_len = local_270._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_2f0,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&DAT_00000014;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = anon_var_dwarf_20dbf68;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = local_2f0._M_string_length;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = local_2f0._M_dataplus._M_p;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&fout;
      cmCatViews_abi_cxx11_(&fc,views_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,&fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fc._M_dataplus._M_p != &fc.field_2) {
        operator_delete(fc._M_dataplus._M_p,
                        CONCAT71(fc.field_2._M_allocated_capacity._1_7_,fc.field_2._M_local_buf[0])
                        + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cleanfile._M_dataplus._M_p != &cleanfile.field_2) {
      operator_delete(cleanfile._M_dataplus._M_p,cleanfile.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cleanFiles);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand(
  std::vector<std::string>& commands)
{
  std::vector<std::string> cleanFiles;
  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(
                   *prop_value, this,
                   this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")),
                 cleanFiles);
  }
  if (cleanFiles.empty()) {
    return;
  }

  const auto& rootLG = this->GetGlobalGenerator()->GetLocalGenerators().at(0);
  std::string const& currentBinaryDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile =
    cmStrCat(currentBinaryDir, "/CMakeFiles/cmake_directory_clean.cmake");
  // Write clean script
  {
    cmsys::ofstream fout(cleanfile.c_str());
    if (!fout) {
      cmSystemTools::Error("Could not create " + cleanfile);
      return;
    }
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& cfl : cleanFiles) {
      std::string fc = rootLG->MaybeRelativeToCurBinDir(
        cmSystemTools::CollapseFullPath(cfl, currentBinaryDir));
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  // Create command
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(rootLG->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }
}